

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joysticks.c
# Opt level: O0

int main(void)

{
  nk_font_atlas *pnVar1;
  int iVar2;
  char *pcVar3;
  float *pfVar4;
  uchar *puVar5;
  long lVar6;
  undefined8 local_118;
  char *names [11];
  char local_b8 [4];
  int hat;
  char name [16];
  GLFWgamepadstate state;
  uchar *hats;
  uchar *buttons;
  float *axes;
  int local_60;
  int hat_count;
  int button_count;
  int axis_count;
  int j;
  nk_rect local_44;
  int local_34;
  int local_30;
  int height;
  int width;
  int i;
  nk_font_atlas *atlas;
  nk_context *nk;
  int local_10;
  int hat_buttons;
  int jid;
  
  hat_buttons = 0;
  nk._4_4_ = 0;
  memset(joysticks,0,0x40);
  glfwSetErrorCallback(error_callback);
  iVar2 = glfwInit();
  if (iVar2 == 0) {
    exit(1);
  }
  glfwWindowHint(0x2200c,1);
  window = glfwCreateWindow(800,600,"Joystick Test",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window != (GLFWwindow *)0x0) {
    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);
    atlas = (nk_font_atlas *)nk_glfw3_init(window,NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin((nk_font_atlas **)&width);
    nk_glfw3_font_stash_end();
    for (local_10 = 0; local_10 < 0x10; local_10 = local_10 + 1) {
      iVar2 = glfwJoystickPresent(local_10);
      if (iVar2 != 0) {
        lVar6 = (long)joystick_count;
        joystick_count = joystick_count + 1;
        joysticks[lVar6] = local_10;
      }
    }
    glfwSetJoystickCallback(joystick_callback);
    glfwSetDropCallback(window,drop_callback);
    while (iVar2 = glfwWindowShouldClose(window), iVar2 == 0) {
      glfwGetWindowSize(window,&local_30,&local_34);
      (*glad_glClear)(0x4000);
      nk_glfw3_new_frame();
      pnVar1 = atlas;
      local_44 = nk_rect((float)local_30 - 200.0,0.0,200.0,(float)local_34);
      iVar2 = nk_begin((nk_context *)pnVar1,"Joysticks",local_44,0x50);
      if (iVar2 != 0) {
        nk_layout_row_dynamic((nk_context *)atlas,30.0,1);
        nk_checkbox_label((nk_context *)atlas,"Hat buttons",(int *)((long)&nk + 4));
        if (joystick_count == 0) {
          nk_label((nk_context *)atlas,"No joysticks connected",0x11);
        }
        else {
          for (height = 0; pnVar1 = atlas, height < joystick_count; height = height + 1) {
            pcVar3 = joystick_label(joysticks[height]);
            iVar2 = nk_button_label((nk_context *)pnVar1,pcVar3);
            pnVar1 = atlas;
            if (iVar2 != 0) {
              pcVar3 = joystick_label(joysticks[height]);
              nk_window_set_focus((nk_context *)pnVar1,pcVar3);
            }
          }
        }
      }
      nk_end((nk_context *)atlas);
      for (height = 0; pnVar1 = atlas, height < joystick_count; height = height + 1) {
        pcVar3 = joystick_label(joysticks[height]);
        _axis_count = nk_rect((float)height * 20.0,(float)height * 20.0,550.0,570.0);
        iVar2 = nk_begin((nk_context *)pnVar1,pcVar3,_axis_count,0x57);
        if (iVar2 != 0) {
          nk_layout_row_dynamic((nk_context *)atlas,30.0,1);
          pnVar1 = atlas;
          pcVar3 = glfwGetJoystickGUID(joysticks[height]);
          nk_labelf((nk_context *)pnVar1,0x11,"Hardware GUID %s",pcVar3);
          nk_label((nk_context *)atlas,"Joystick state",0x11);
          pfVar4 = glfwGetJoystickAxes(joysticks[height],&hat_count);
          puVar5 = glfwGetJoystickButtons(joysticks[height],&local_60);
          state.axes._16_8_ = glfwGetJoystickHats(joysticks[height],(int *)((long)&axes + 4));
          if (nk._4_4_ == 0) {
            local_60 = local_60 + axes._4_4_ * -4;
          }
          for (button_count = 0; button_count < hat_count; button_count = button_count + 1) {
            nk_slide_float((nk_context *)atlas,-1.0,pfVar4[button_count],1.0,0.1);
          }
          nk_layout_row_dynamic((nk_context *)atlas,30.0,0xc);
          for (button_count = 0; button_count < local_60; button_count = button_count + 1) {
            snprintf(local_b8,0x10,"%i",(ulong)(button_count + 1));
            nk_select_label((nk_context *)atlas,local_b8,0x12,(uint)puVar5[button_count]);
          }
          nk_layout_row_dynamic((nk_context *)atlas,30.0,8);
          for (button_count = 0; button_count < axes._4_4_; button_count = button_count + 1) {
            hat_widget((nk_context *)atlas,*(uchar *)(state.axes._16_8_ + (long)button_count));
          }
          nk_layout_row_dynamic((nk_context *)atlas,30.0,1);
          iVar2 = glfwGetGamepadState(joysticks[height],(GLFWgamepadstate *)(name + 8));
          if (iVar2 == 0) {
            nk_label((nk_context *)atlas,"Joystick has no gamepad mapping",0x11);
          }
          else {
            names[10]._4_4_ = 0;
            memcpy(&local_118,&DAT_001c5c90,0x58);
            pnVar1 = atlas;
            pcVar3 = glfwGetGamepadName(joysticks[height]);
            nk_labelf((nk_context *)pnVar1,0x11,"Gamepad state: %s",pcVar3);
            nk_layout_row_dynamic((nk_context *)atlas,30.0,2);
            for (button_count = 0; button_count < 6; button_count = button_count + 1) {
              nk_slide_float((nk_context *)atlas,-1.0,state.axes[(long)button_count + -2],1.0,0.1);
            }
            nk_layout_row_dynamic((nk_context *)atlas,30.0,0xb);
            for (button_count = 0; button_count < 0xb; button_count = button_count + 1) {
              nk_select_label((nk_context *)atlas,names[(long)button_count + -1],0x12,
                              (uint)(byte)name[(long)button_count + 8]);
            }
            if (state.buttons[3] != '\0') {
              names[10]._4_4_ = names[10]._4_4_ | 1;
            }
            if (state.buttons[4] != '\0') {
              names[10]._4_4_ = names[10]._4_4_ | 2;
            }
            if (state.buttons[5] != '\0') {
              names[10]._4_4_ = names[10]._4_4_ | 4;
            }
            if (state.buttons[6] != '\0') {
              names[10]._4_4_ = names[10]._4_4_ | 8;
            }
            nk_layout_row_dynamic((nk_context *)atlas,30.0,8);
            hat_widget((nk_context *)atlas,(uchar)names[10]._4_4_);
          }
        }
        nk_end((nk_context *)atlas);
      }
      nk_glfw3_render(NK_ANTI_ALIASING_ON);
      glfwSwapBuffers(window);
      glfwPollEvents();
    }
    glfwTerminate();
    exit(0);
  }
  glfwTerminate();
  exit(1);
}

Assistant:

int main(void)
{
    int jid, hat_buttons = GLFW_FALSE;
    struct nk_context* nk;
    struct nk_font_atlas* atlas;

    memset(joysticks, 0, sizeof(joysticks));

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    glfwWindowHint(GLFW_SCALE_TO_MONITOR, GLFW_TRUE);

    window = glfwCreateWindow(800, 600, "Joystick Test", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);
    gladLoadGL(glfwGetProcAddress);
    glfwSwapInterval(1);

    nk = nk_glfw3_init(window, NK_GLFW3_INSTALL_CALLBACKS);
    nk_glfw3_font_stash_begin(&atlas);
    nk_glfw3_font_stash_end();

    for (jid = GLFW_JOYSTICK_1;  jid <= GLFW_JOYSTICK_LAST;  jid++)
    {
        if (glfwJoystickPresent(jid))
            joysticks[joystick_count++] = jid;
    }

    glfwSetJoystickCallback(joystick_callback);
    glfwSetDropCallback(window, drop_callback);

    while (!glfwWindowShouldClose(window))
    {
        int i, width, height;

        glfwGetWindowSize(window, &width, &height);

        glClear(GL_COLOR_BUFFER_BIT);
        nk_glfw3_new_frame();

        if (nk_begin(nk,
                     "Joysticks",
                     nk_rect(width - 200.f, 0.f, 200.f, (float) height),
                     NK_WINDOW_MINIMIZABLE |
                     NK_WINDOW_TITLE))
        {
            nk_layout_row_dynamic(nk, 30, 1);

            nk_checkbox_label(nk, "Hat buttons", &hat_buttons);

            if (joystick_count)
            {
                for (i = 0;  i < joystick_count;  i++)
                {
                    if (nk_button_label(nk, joystick_label(joysticks[i])))
                        nk_window_set_focus(nk, joystick_label(joysticks[i]));
                }
            }
            else
                nk_label(nk, "No joysticks connected", NK_TEXT_LEFT);
        }

        nk_end(nk);

        for (i = 0;  i < joystick_count;  i++)
        {
            if (nk_begin(nk,
                         joystick_label(joysticks[i]),
                         nk_rect(i * 20.f, i * 20.f, 550.f, 570.f),
                         NK_WINDOW_BORDER |
                         NK_WINDOW_MOVABLE |
                         NK_WINDOW_SCALABLE |
                         NK_WINDOW_MINIMIZABLE |
                         NK_WINDOW_TITLE))
            {
                int j, axis_count, button_count, hat_count;
                const float* axes;
                const unsigned char* buttons;
                const unsigned char* hats;
                GLFWgamepadstate state;

                nk_layout_row_dynamic(nk, 30, 1);
                nk_labelf(nk, NK_TEXT_LEFT, "Hardware GUID %s",
                          glfwGetJoystickGUID(joysticks[i]));
                nk_label(nk, "Joystick state", NK_TEXT_LEFT);

                axes = glfwGetJoystickAxes(joysticks[i], &axis_count);
                buttons = glfwGetJoystickButtons(joysticks[i], &button_count);
                hats = glfwGetJoystickHats(joysticks[i], &hat_count);

                if (!hat_buttons)
                    button_count -= hat_count * 4;

                for (j = 0;  j < axis_count;  j++)
                    nk_slide_float(nk, -1.f, axes[j], 1.f, 0.1f);

                nk_layout_row_dynamic(nk, 30, 12);

                for (j = 0;  j < button_count;  j++)
                {
                    char name[16];
                    snprintf(name, sizeof(name), "%i", j + 1);
                    nk_select_label(nk, name, NK_TEXT_CENTERED, buttons[j]);
                }

                nk_layout_row_dynamic(nk, 30, 8);

                for (j = 0;  j < hat_count;  j++)
                    hat_widget(nk, hats[j]);

                nk_layout_row_dynamic(nk, 30, 1);

                if (glfwGetGamepadState(joysticks[i], &state))
                {
                    int hat = 0;
                    const char* names[GLFW_GAMEPAD_BUTTON_LAST + 1 - 4] =
                    {
                        "A", "B", "X", "Y",
                        "LB", "RB",
                        "Back", "Start", "Guide",
                        "LT", "RT",
                    };

                    nk_labelf(nk, NK_TEXT_LEFT,
                              "Gamepad state: %s",
                              glfwGetGamepadName(joysticks[i]));

                    nk_layout_row_dynamic(nk, 30, 2);

                    for (j = 0;  j <= GLFW_GAMEPAD_AXIS_LAST;  j++)
                        nk_slide_float(nk, -1.f, state.axes[j], 1.f, 0.1f);

                    nk_layout_row_dynamic(nk, 30, GLFW_GAMEPAD_BUTTON_LAST + 1 - 4);

                    for (j = 0;  j <= GLFW_GAMEPAD_BUTTON_LAST - 4;  j++)
                        nk_select_label(nk, names[j], NK_TEXT_CENTERED, state.buttons[j]);

                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_UP])
                        hat |= GLFW_HAT_UP;
                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_RIGHT])
                        hat |= GLFW_HAT_RIGHT;
                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_DOWN])
                        hat |= GLFW_HAT_DOWN;
                    if (state.buttons[GLFW_GAMEPAD_BUTTON_DPAD_LEFT])
                        hat |= GLFW_HAT_LEFT;

                    nk_layout_row_dynamic(nk, 30, 8);
                    hat_widget(nk, hat);
                }
                else
                    nk_label(nk, "Joystick has no gamepad mapping", NK_TEXT_LEFT);
            }

            nk_end(nk);
        }

        nk_glfw3_render(NK_ANTI_ALIASING_ON);

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwTerminate();
    exit(EXIT_SUCCESS);
}